

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall
cmTargetTraceDependencies::CheckCustomCommand(cmTargetTraceDependencies *this,cmCustomCommand *cc)

{
  size_t *psVar1;
  cmTarget *this_00;
  bool bVar2;
  TargetType TVar3;
  cmListFileBacktrace *pcVar4;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *this_01;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_02;
  const_reference name;
  cmGeneratorTarget *this_03;
  pointer pcVar5;
  cmLocalGenerator *lg;
  set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
  *psVar6;
  iterator __first;
  iterator __last;
  reference ppcVar7;
  string *name_00;
  reference config;
  string *conf;
  iterator __end1_2;
  iterator __begin1_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_2;
  undefined1 local_1c0 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emitted;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  cmGeneratorTarget *target;
  iterator __end1_1;
  iterator __begin1_1;
  set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
  *__range1_1;
  undefined1 local_148 [8];
  set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
  geTargets;
  allocator<char> local_f1;
  string local_f0;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  string *cl;
  const_iterator __end2;
  const_iterator __begin2;
  cmCustomCommandLine *__range2;
  cmGeneratorTarget *t;
  string *command;
  cmCustomCommandLine *cCmdLine;
  const_iterator __end1;
  const_iterator __begin1;
  cmCustomCommandLines *__range1;
  set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
  targets;
  cmListFileBacktrace local_38;
  undefined1 local_28 [8];
  cmGeneratorExpression ge;
  cmCustomCommand *cc_local;
  cmTargetTraceDependencies *this_local;
  
  ge.Backtrace.TopEntry.
  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)cc;
  pcVar4 = cmCustomCommand::GetBacktrace(cc);
  cmListFileBacktrace::cmListFileBacktrace(&local_38,pcVar4);
  cmGeneratorExpression::cmGeneratorExpression((cmGeneratorExpression *)local_28,&local_38);
  cmListFileBacktrace::~cmListFileBacktrace(&local_38);
  std::
  set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>::
  set((set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
       *)&__range1);
  this_01 = &cmCustomCommand::GetCommandLines
                       ((cmCustomCommand *)
                        ge.Backtrace.TopEntry.
                        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->
             super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>;
  __end1 = std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::begin(this_01);
  cCmdLine = (cmCustomCommandLine *)
             std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::end(this_01);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_cmCustomCommandLine_*,_std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>_>
                                     *)&cCmdLine), bVar2) {
    this_02 = &__gnu_cxx::
               __normal_iterator<const_cmCustomCommandLine_*,_std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>_>
               ::operator*(&__end1)->
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ;
    name = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::front(this_02);
    this_03 = cmLocalGenerator::FindGeneratorTargetToUse(this->LocalGenerator,name);
    if ((this_03 != (cmGeneratorTarget *)0x0) &&
       (TVar3 = cmGeneratorTarget::GetType(this_03), TVar3 == EXECUTABLE)) {
      cmTarget::AddUtility(this->GeneratorTarget->Target,name,(cmMakefile *)0x0);
    }
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(this_02);
    cl = (string *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(this_02);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&cl), bVar2) {
      cge._M_t.
      super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
      .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl =
           (__uniq_ptr_data<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>,_true,_true>
            )__gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end2);
      cmGeneratorExpression::Parse
                ((cmGeneratorExpression *)&stack0xffffffffffffff30,(string *)local_28);
      pcVar5 = std::
               unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               ::operator->((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                             *)&stack0xffffffffffffff30);
      lg = cmGeneratorTarget::GetLocalGenerator(this->GeneratorTarget);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"",&local_f1);
      psVar1 = &geTargets._M_t._M_impl.super__Rb_tree_header._M_node_count;
      std::__cxx11::string::string((string *)psVar1);
      cmCompiledGeneratorExpression::Evaluate
                (pcVar5,lg,&local_f0,true,(cmGeneratorTarget *)0x0,(cmGeneratorTarget *)0x0,
                 (cmGeneratorExpressionDAGChecker *)0x0,(string *)psVar1);
      std::__cxx11::string::~string
                ((string *)&geTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::__cxx11::string::~string((string *)&local_f0);
      std::allocator<char>::~allocator(&local_f1);
      pcVar5 = std::
               unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               ::operator->((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                             *)&stack0xffffffffffffff30);
      psVar6 = cmCompiledGeneratorExpression::GetTargets(pcVar5);
      std::
      set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
      ::set((set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
             *)local_148,psVar6);
      __first = std::
                set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
                ::begin((set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
                         *)local_148);
      __last = std::
               set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
               ::end((set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
                      *)local_148);
      std::set<cmGeneratorTarget*,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
      ::insert<std::_Rb_tree_const_iterator<cmGeneratorTarget*>>
                ((set<cmGeneratorTarget*,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
                  *)&__range1,(_Rb_tree_const_iterator<cmGeneratorTarget_*>)__first._M_node,
                 (_Rb_tree_const_iterator<cmGeneratorTarget_*>)__last._M_node);
      std::
      set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
      ::~set((set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
              *)local_148);
      std::
      unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
      ::~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                     *)&stack0xffffffffffffff30);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    __gnu_cxx::
    __normal_iterator<const_cmCustomCommandLine_*,_std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>_>
    ::operator++(&__end1);
  }
  __end1_1 = std::
             set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
             ::begin((set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
                      *)&__range1);
  target = (cmGeneratorTarget *)
           std::
           set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
           ::end((set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
                  *)&__range1);
  while (bVar2 = std::operator!=(&__end1_1,(_Self *)&target), bVar2) {
    ppcVar7 = std::_Rb_tree_const_iterator<cmGeneratorTarget_*>::operator*(&__end1_1);
    this_00 = this->GeneratorTarget->Target;
    name_00 = cmGeneratorTarget::GetName_abi_cxx11_(*ppcVar7);
    cmTarget::AddUtility(this_00,name_00,(cmMakefile *)0x0);
    std::_Rb_tree_const_iterator<cmGeneratorTarget_*>::operator++(&__end1_1);
  }
  psVar1 = &emitted._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)psVar1);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_1c0);
  cmMakefile::GetConfigurations
            ((string *)&__range1_2,this->Makefile,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)psVar1,true);
  std::__cxx11::string::~string((string *)&__range1_2);
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&emitted._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if (bVar2) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::emplace_back<>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&emitted._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  psVar1 = &emitted._M_t._M_impl.super__Rb_tree_header._M_node_count;
  __end1_2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)psVar1);
  conf = (string *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)psVar1);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1_2,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&conf), bVar2) {
    config = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1_2);
    FollowCommandDepends
              (this,(cmCustomCommand *)
                    ge.Backtrace.TopEntry.
                    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi,config,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_1c0);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1_2);
  }
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_1c0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&emitted._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>::
  ~set((set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
        *)&__range1);
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_28);
  return;
}

Assistant:

void cmTargetTraceDependencies::CheckCustomCommand(cmCustomCommand const& cc)
{
  // Transform command names that reference targets built in this
  // project to corresponding target-level dependencies.
  cmGeneratorExpression ge(cc.GetBacktrace());

  // Add target-level dependencies referenced by generator expressions.
  std::set<cmGeneratorTarget*> targets;

  for (cmCustomCommandLine const& cCmdLine : cc.GetCommandLines()) {
    std::string const& command = cCmdLine.front();
    // Check for a target with this name.
    if (cmGeneratorTarget* t =
          this->LocalGenerator->FindGeneratorTargetToUse(command)) {
      if (t->GetType() == cmStateEnums::EXECUTABLE) {
        // The command refers to an executable target built in
        // this project.  Add the target-level dependency to make
        // sure the executable is up to date before this custom
        // command possibly runs.
        this->GeneratorTarget->Target->AddUtility(command);
      }
    }

    // Check for target references in generator expressions.
    for (std::string const& cl : cCmdLine) {
      const std::unique_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(cl);
      cge->Evaluate(this->GeneratorTarget->GetLocalGenerator(), "", true);
      std::set<cmGeneratorTarget*> geTargets = cge->GetTargets();
      targets.insert(geTargets.begin(), geTargets.end());
    }
  }

  for (cmGeneratorTarget* target : targets) {
    this->GeneratorTarget->Target->AddUtility(target->GetName());
  }

  // Queue the custom command dependencies.
  std::vector<std::string> configs;
  std::set<std::string> emitted;
  this->Makefile->GetConfigurations(configs);
  if (configs.empty()) {
    configs.emplace_back();
  }
  for (std::string const& conf : configs) {
    this->FollowCommandDepends(cc, conf, emitted);
  }
}